

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_FieldOptionValueError_Test::
ParserValidationErrorTest_FieldOptionValueError_Test
          (ParserValidationErrorTest_FieldOptionValueError_Test *this)

{
  ParserValidationErrorTest_FieldOptionValueError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParserValidationErrorTest);
  (this->super_ParserValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserValidationErrorTest_FieldOptionValueError_Test_02a0eed0;
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, FieldOptionValueError) {
  ExpectHasValidationErrors(
      "message Foo {\n"
      "  optional int32 bar = 1 [ctype=1];\n"
      "}\n",
      "1:32: Value must be identifier for enum-valued option "
      "\"google.protobuf.FieldOptions.ctype\".\n");
}